

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef,_4UL>::
         Construct(DB *db,LIST *params)

{
  IfcIShapeProfileDef *this;
  
  this = (IfcIShapeProfileDef *)operator_new(0x110);
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p =
       (pointer)&PTR__Object_00816a50;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr._M_string_length = 0;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.field_2.
  _M_allocated_capacity = (size_type)"IfcAsymmetricIShapeProfileDef";
  Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::IfcIShapeProfileDef
            (this,&PTR_construction_vtable_24__0085eec0);
  *(undefined8 *)&this->field_0xb8 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcAsymmetricIShapeProfileDef_0085ee08;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p =
       (pointer)&PTR__IfcAsymmetricIShapeProfileDef_0085eea8;
  *(undefined ***)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       &PTR__IfcAsymmetricIShapeProfileDef_0085ee30;
  *(undefined ***)&(this->super_IfcParameterizedProfileDef).field_0x70 =
       &PTR__IfcAsymmetricIShapeProfileDef_0085ee58;
  *(undefined ***)&this->field_0xb0 = &PTR__IfcAsymmetricIShapeProfileDef_0085ee80;
  *(undefined1 *)
   &this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.aux_is_derived.
    super__Base_bitset<1UL>._M_w = 0;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x18 = 0;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x28 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }